

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyScoped_NoFastPath<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint localRegisterID;
  InlineCacheIndex inlineCacheIndex;
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar1;
  InlineCache *inlineCache;
  FrameDisplay *pDisplay;
  
  pvVar1 = GetReg<unsigned_int>(this,1);
  functionBody = *(FunctionBody **)(this + 0x88);
  localRegisterID = playout->Value;
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  pDisplay = GetEnvForEvalCode(this);
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pvVar1 = JavascriptOperators::PatchGetPropertyScoped<false,Js::InlineCache>
                     (functionBody,inlineCache,inlineCacheIndex,pDisplay,propertyId,pvVar1);
  SetReg<unsigned_int>(this,localRegisterID,pvVar1);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetPropertyScoped_NoFastPath(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        // Implicit root object as default instance
        Var defaultInstance = GetReg(Js::FunctionBody::RootObjectRegSlot);

        // PatchGetPropertyScoped doesn't update type and slotIndex if the scope is not an array of length 1.
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                defaultInstance));
    }